

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O3

bool __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::executeHandlers
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,Node *parent,int urlSegment,
          RouterData *userData)

{
  int *piVar1;
  char cVar2;
  uint *puVar3;
  pointer pfVar4;
  pointer puVar5;
  Node *parent_00;
  size_t __n;
  char *__s1;
  bool bVar6;
  int iVar7;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
  *p;
  uint *puVar8;
  pointer puVar9;
  uint *puVar10;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_48;
  
  getUrlSegment(&local_48,this,urlSegment);
  if (local_48.second == true) {
    puVar10 = (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar3) {
      do {
        puVar8 = puVar10 + 1;
        pfVar4 = (this->handlers).
                 super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = (*pfVar4[*puVar10 & 0xfffffff].erasure_.vtable_.vtable_)
                          ((data_accessor *)(pfVar4 + (*puVar10 & 0xfffffff)),0x10,this);
        if (bVar6) {
          return bVar6;
        }
        puVar10 = puVar8;
      } while (puVar8 != puVar3);
      return bVar6;
    }
  }
  else {
    puVar9 = (parent->children).
             super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (parent->children).
             super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != puVar5) {
      do {
        parent_00 = (puVar9->_M_t).
                    super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                    .
                    super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
                    ._M_head_impl;
        __n = (parent_00->name)._M_string_length;
        if (__n == 0) {
          if (local_48.first._M_len == 0) {
LAB_0014b023:
            bVar6 = executeHandlers(this,parent_00,urlSegment + 1,userData);
            if (bVar6) {
              return true;
            }
          }
        }
        else {
          __s1 = (parent_00->name)._M_dataplus._M_p;
          cVar2 = *__s1;
          if (cVar2 == '*') {
            puVar3 = *(pointer *)
                      ((long)&(parent_00->handlers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8);
            for (puVar10 = (parent_00->handlers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar10 != puVar3;
                puVar10 = puVar10 + 1) {
              pfVar4 = (this->handlers).
                       super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar6 = (*pfVar4[*puVar10 & 0xfffffff].erasure_.vtable_.vtable_)
                                ((data_accessor *)(pfVar4 + (*puVar10 & 0xfffffff)),0x10,this);
              if (bVar6) {
                return true;
              }
            }
          }
          else if (local_48.first._M_len == 0 || cVar2 != ':') {
            if ((__n == local_48.first._M_len) &&
               (iVar7 = bcmp(__s1,local_48.first._M_str,__n), iVar7 == 0)) goto LAB_0014b023;
          }
          else {
            iVar7 = (this->routeParameters).paramsTop;
            (this->routeParameters).paramsTop = iVar7 + 1;
            (this->routeParameters).params[(long)iVar7 + 1]._M_len = local_48.first._M_len;
            (this->routeParameters).params[(long)iVar7 + 1]._M_str = local_48.first._M_str;
            bVar6 = executeHandlers(this,(puVar9->_M_t).
                                         super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                         .
                                         super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
                                         ._M_head_impl,urlSegment + 1,userData);
            if (bVar6) {
              return true;
            }
            piVar1 = &(this->routeParameters).paramsTop;
            *piVar1 = *piVar1 + -1;
          }
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar5);
    }
  }
  return false;
}

Assistant:

bool executeHandlers(Node *parent, int urlSegment, USERDATA &userData) {

        auto [segment, isStop] = getUrlSegment(urlSegment);

        /* If we are on STOP, return where we may stand */
        if (isStop) {
            /* We have reached accross the entire URL with no stoppage, execute */
            for (int handler : parent->handlers) {
                if (handlers[handler & HANDLER_MASK](this)) {
                    return true;
                }
            }
            /* We reached the end, so go back */
            return false;
        }

        for (auto &p : parent->children) {
            if (p->name.length() && p->name[0] == '*') {
                /* Wildcard match (can be seen as a shortcut) */
                for (int handler : p->handlers) {
                    if (handlers[handler & HANDLER_MASK](this)) {
                        return true;
                    }
                }
            } else if (p->name.length() && p->name[0] == ':' && segment.length()) {
                /* Parameter match */
                routeParameters.push(segment);
                if (executeHandlers(p.get(), urlSegment + 1, userData)) {
                    return true;
                }
                routeParameters.pop();
            } else if (p->name == segment) {
                /* Static match */
                if (executeHandlers(p.get(), urlSegment + 1, userData)) {
                    return true;
                }
            }
        }
        return false;
    }